

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_dofhandler.cc
# Opt level: O0

size_type __thiscall
projects::dpg::ProductUniformFEDofHandler::NumInteriorDofs
          (ProductUniformFEDofHandler *this,Entity *entity)

{
  int iVar1;
  dim_t dVar2;
  uint uVar3;
  element_type *peVar4;
  const_reference this_00;
  const_reference this_01;
  size_type sVar5;
  size_type num_dofs;
  glb_idx_t entity_idx;
  Entity *pEStack_18;
  dim_t codim;
  Entity *entity_local;
  ProductUniformFEDofHandler *this_local;
  
  pEStack_18 = entity;
  entity_local = (Entity *)this;
  iVar1 = (*entity->_vptr_Entity[4])();
  num_dofs._3_1_ = (undefined1)iVar1;
  dVar2 = lf::base::RefEl::Dimension((RefEl *)((long)&num_dofs + 3));
  entity_idx = 2 - dVar2;
  peVar4 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  uVar3 = (*peVar4->_vptr_Mesh[5])(peVar4,pEStack_18);
  this_00 = std::
            array<std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>,_3UL>
            ::operator[](&this->internal_dofs_,(ulong)entity_idx);
  this_01 = std::
            vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            ::operator[](this_00,(ulong)uVar3);
  sVar5 = std::vector<long,_std::allocator<long>_>::size(this_01);
  return (size_type)sVar5;
}

Assistant:

size_type ProductUniformFEDofHandler::NumInteriorDofs(
    const lf::mesh::Entity& entity) const {
  const dim_t codim = 2 - entity.RefEl().Dimension();
  const glb_idx_t entity_idx = mesh_p_->Index(entity);
  const size_type num_dofs = internal_dofs_[codim][entity_idx].size();
  return num_dofs;
}